

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamIOException.hpp
# Opt level: O1

void __thiscall antlr::TokenStreamIOException::~TokenStreamIOException(TokenStreamIOException *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamIOException_002bb440;
  std::exception::~exception(&this->io);
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__ANTLRException_002ba910;
  pcVar1 = (this->super_TokenStreamException).super_ANTLRException.text._M_dataplus._M_p;
  paVar2 = &(this->super_TokenStreamException).super_ANTLRException.text.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~TokenStreamIOException() throw()
	{
	}